

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfileio.hpp
# Opt level: O3

bool __thiscall
soplex::SPxSolverBase<double>::writeBasisFile
          (SPxSolverBase<double> *this,char *filename,NameSet *rowNames,NameSet *colNames,
          bool cpxFormat)

{
  uint uVar1;
  ofstream file;
  long local_228;
  filebuf local_220 [24];
  uint auStack_208 [54];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228,filename,_S_out);
  uVar1 = *(uint *)((long)auStack_208 + *(long *)(local_228 + -0x18));
  if ((uVar1 & 5) == 0) {
    (*(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase[2])
              (&this->super_SPxBasisBase<double>,&local_228,rowNames,colNames,0);
  }
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return (uVar1 & 5) == 0;
}

Assistant:

bool SPxSolverBase<R>::writeBasisFile
(const char*    filename,
 const NameSet* rowNames,
 const NameSet* colNames,
 const bool cpxFormat) const
{
   std::ofstream file(filename);

   if(!file)
      return false;

   this->writeBasis(file, rowNames, colNames);
   return true;
}